

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O2

void __thiscall
iqxmlrpc::http::Response_header::Response_header
          (Response_header *this,Verification_level lev,string *to_parse)

{
  iterator *this_00;
  int iVar1;
  size_type sVar2;
  reference arg;
  Malformed_packet *this_01;
  allocator<char> local_aa;
  allocator<char> local_a9;
  string local_a8;
  is_classifiedF local_88;
  Token resp_line;
  
  Header::Header(&this->super_Header,lev);
  (this->super_Header)._vptr_Header = (_func_int **)&PTR__Response_header_0019cb70;
  (this->phrase_)._M_dataplus._M_p = (pointer)&(this->phrase_).field_2;
  (this->phrase_)._M_string_length = 0;
  (this->phrase_).field_2._M_local_buf[0] = '\0';
  Header::parse(&this->super_Header,to_parse);
  std::__cxx11::string::string<std::allocator<char>>((string *)&resp_line,"server",&local_aa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"unknown",&local_a9);
  Header::set_option_default(&this->super_Header,(string *)&resp_line,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&resp_line);
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&resp_line.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  std::locale::locale((locale *)&local_a8);
  boost::algorithm::is_space((locale *)&local_88);
  boost::algorithm::
  split<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_classifiedF>
            (&resp_line,&(this->super_Header).head_line_,&local_88,token_compress_on);
  std::locale::~locale(&local_88.m_Locale);
  std::locale::~locale((locale *)&local_a8);
  sVar2 = std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&resp_line);
  if (1 < sVar2) {
    this_00 = &resp_line.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start;
    arg = std::
          _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
          ::operator[](this_00,1);
    iVar1 = boost::lexical_cast<int,std::__cxx11::string>(arg);
    *(int *)&(this->super_Header).field_0x8c = iVar1;
    sVar2 = std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&resp_line);
    if (2 < sVar2) {
      std::
      _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
      ::operator[](this_00,2);
      std::__cxx11::string::_M_assign((string *)&this->phrase_);
    }
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~deque(&resp_line);
    return;
  }
  this_01 = (Malformed_packet *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Bad response",&local_aa);
  Malformed_packet::Malformed_packet(this_01,&local_a8);
  __cxa_throw(this_01,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Response_header::Response_header(Verification_level lev, const std::string& to_parse):
  Header(lev)
{
  parse(to_parse);
  set_option_default(names::server, "unknown");

  typedef std::deque<std::string> Token;
  Token resp_line;
  boost::split(resp_line, get_head_line(), boost::is_space(), boost::token_compress_on);

  if (resp_line.size() < 2) {
    throw Malformed_packet("Bad response");
  }

  try {
    code_ = boost::lexical_cast<int>(resp_line[1]);
  } catch (const boost::bad_lexical_cast&) {
    code_ = 0;
  }

  if (resp_line.size() > 2)
    phrase_ = resp_line[2];
}